

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_format_specs<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
          (internal *this,null_terminating_iterator<char> it,
          specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
          *handler)

{
  uint *puVar1;
  align_spec *paVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  basic_format_specs<char> *pbVar8;
  byte bVar9;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  *this_00;
  long lVar10;
  internal iVar11;
  basic_format_specs<char> *pbVar12;
  char *message;
  basic_parse_context<char,_fmt::v5::internal::error_handler> *this_01;
  bool bVar13;
  alignment aVar14;
  null_terminating_iterator<char> it_00;
  null_terminating_iterator<char> nVar15;
  null_terminating_iterator<char> nVar16;
  null_terminating_iterator<char> local_50;
  wchar_t local_3c;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
  *local_38;
  
  this_00 = (specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
             *)it.end_;
  pbVar12 = (basic_format_specs<char> *)it.ptr_;
  if ((basic_format_specs<char> *)this == pbVar12) {
    iVar11 = (internal)0x0;
  }
  else {
    iVar11 = *this;
  }
  if ((iVar11 == (internal)0x0) || (iVar11 == (internal)0x7d)) goto LAB_00191a02;
  local_3c = (wchar_t)(char)iVar11;
  bVar4 = false;
  lVar10 = 1;
  aVar14 = ALIGN_DEFAULT;
  bVar3 = true;
  local_50.ptr_ = (char *)this;
  local_50.end_ = (char *)pbVar12;
  do {
    bVar13 = bVar3;
    pbVar8 = (basic_format_specs<char> *)((long)&((align_spec *)local_50.ptr_)->width_ + lVar10);
    if (pbVar8 == (basic_format_specs<char> *)local_50.end_) {
      bVar9 = 0;
    }
    else {
      bVar9 = *(byte *)&(pbVar8->super_align_spec).width_;
    }
    if (bVar9 < 0x3e) {
      if (bVar9 == 0x3c) {
        aVar14 = ALIGN_LEFT;
      }
      else if (bVar9 == 0x3d) {
        aVar14 = ALIGN_NUMERIC;
      }
    }
    else if (bVar9 == 0x3e) {
      aVar14 = ALIGN_RIGHT;
    }
    else if (bVar9 == 0x5e) {
      aVar14 = ALIGN_CENTER;
    }
    pbVar8 = (basic_format_specs<char> *)local_50.ptr_;
    if (aVar14 == ALIGN_DEFAULT) {
      iVar6 = 0;
    }
    else {
      if (bVar4) {
        pbVar8 = (basic_format_specs<char> *)((long)&((align_spec *)local_50.ptr_)->width_ + 1);
        local_50.ptr_ = (char *)pbVar8;
      }
      else {
        if (iVar11 == (internal)0x7b) {
          basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                    ((this_00->
                     super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                     ).context_,"invalid fill character \'{\'");
          iVar6 = 1;
          pbVar12 = (basic_format_specs<char> *)local_50.end_;
          this = (internal *)local_50.ptr_;
          goto LAB_001917ca;
        }
        local_50.ptr_ = (char *)((long)&((align_spec *)local_50.ptr_)->width_ + 2);
        pbVar8 = (basic_format_specs<char> *)(ulong)(uint)local_3c;
        (((this_00->
          super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
          ).super_specs_setter<char>.specs_)->super_align_spec).fill_ = local_3c;
      }
      if (aVar14 == ALIGN_NUMERIC) {
        specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
        ::require_numeric_argument(this_00);
      }
      (((this_00->
        super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
        ).super_specs_setter<char>.specs_)->super_align_spec).align_ = aVar14;
      iVar6 = 2;
    }
LAB_001917ca:
    if (iVar6 != 0) {
      if (iVar6 != 2) goto LAB_00191a02;
      break;
    }
    bVar4 = true;
    lVar10 = 0;
    bVar3 = false;
  } while (bVar13);
  if (local_50.ptr_ == local_50.end_) {
    cVar5 = '\0';
  }
  else {
    cVar5 = *(char *)&((align_spec *)local_50.ptr_)->width_;
  }
  if (cVar5 == ' ') {
    specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
    ::check_sign(this_00);
    puVar1 = &((this_00->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
               ).super_specs_setter<char>.specs_)->flags_;
    *puVar1 = *puVar1 | 1;
LAB_00191841:
    local_50.ptr_ = (char *)((long)&((align_spec *)local_50.ptr_)->width_ + 1);
  }
  else {
    if (cVar5 == '-') {
      specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
      ::check_sign(this_00);
      puVar1 = &((this_00->
                 super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                 ).super_specs_setter<char>.specs_)->flags_;
      *puVar1 = *puVar1 | 4;
      goto LAB_00191841;
    }
    if (cVar5 == '+') {
      specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
      ::check_sign(this_00);
      puVar1 = &((this_00->
                 super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                 ).super_specs_setter<char>.specs_)->flags_;
      *puVar1 = *puVar1 | 3;
      goto LAB_00191841;
    }
  }
  if ((local_50.ptr_ != local_50.end_) && (*(char *)&((align_spec *)local_50.ptr_)->width_ == '#'))
  {
    specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
    ::require_numeric_argument(this_00);
    puVar1 = &((this_00->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
               ).super_specs_setter<char>.specs_)->flags_;
    *puVar1 = *puVar1 | 8;
    local_50.ptr_ = (char *)((long)&((align_spec *)local_50.ptr_)->width_ + 1);
  }
  if ((local_50.ptr_ != local_50.end_) && (*(char *)&((align_spec *)local_50.ptr_)->width_ == '0'))
  {
    specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
    ::require_numeric_argument(this_00);
    pbVar12 = (this_00->
              super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
              ).super_specs_setter<char>.specs_;
    pbVar8 = (basic_format_specs<char> *)0x400000030;
    (pbVar12->super_align_spec).fill_ = L'0';
    (pbVar12->super_align_spec).align_ = ALIGN_NUMERIC;
    local_50.ptr_ = (char *)((long)&((align_spec *)local_50.ptr_)->width_ + 1);
  }
  if (local_50.ptr_ == local_50.end_) {
LAB_0019190b:
    if ((local_50.ptr_ != local_50.end_) && (*(char *)&((align_spec *)local_50.ptr_)->width_ == '.')
       ) {
      pbVar12 = (basic_format_specs<char> *)((long)&((align_spec *)local_50.ptr_)->width_ + 1);
      if (pbVar12 == (basic_format_specs<char> *)local_50.end_) {
LAB_001919d9:
        this_01 = (this_00->
                  super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
                  ).context_;
        message = "missing precision specifier";
        local_50.ptr_ = (char *)pbVar12;
        goto LAB_001919e4;
      }
      if ((*(char *)&(pbVar12->super_align_spec).width_ < '0') ||
         ((pbVar12 != (basic_format_specs<char> *)local_50.end_ &&
          ('9' < *(char *)&(pbVar12->super_align_spec).width_)))) {
        if ((pbVar12 == (basic_format_specs<char> *)local_50.end_) ||
           (*(char *)&(pbVar12->super_align_spec).width_ != '{')) goto LAB_001919d9;
        paVar2 = (align_spec *)local_50.ptr_;
        it_00.end_ = (char *)&local_38;
        it_00.ptr_ = local_50.end_;
        local_38 = this_00;
        local_50.ptr_ = (char *)pbVar12;
        nVar15 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>>
                           ((internal *)((long)&paVar2->width_ + 2),it_00,
                            (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
                             *)pbVar8);
        local_50.end_ = nVar15.end_;
        pbVar12 = (basic_format_specs<char> *)nVar15.ptr_;
        local_50.ptr_ = (char *)((long)&(pbVar12->super_align_spec).width_ + 1);
        if ((pbVar12 == (basic_format_specs<char> *)local_50.end_) ||
           (*(char *)&(pbVar12->super_align_spec).width_ != '}')) goto LAB_001919cc;
      }
      else {
        local_50.ptr_ = (char *)pbVar12;
        uVar7 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                          (&local_50,this_00);
        ((this_00->
         super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
         ).super_specs_setter<char>.specs_)->precision_ = uVar7;
      }
      specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>
      ::end_precision(this_00);
    }
    pbVar12 = (basic_format_specs<char> *)local_50.end_;
    this = (internal *)local_50.ptr_;
    if ((((local_50.ptr_ != local_50.end_) && (local_50.ptr_ != local_50.end_)) &&
        (*(char *)&((align_spec *)local_50.ptr_)->width_ != '}')) &&
       (*(char *)&((align_spec *)local_50.ptr_)->width_ != '\0')) {
      this = (internal *)((long)&((align_spec *)local_50.ptr_)->width_ + 1);
      if (local_50.ptr_ == local_50.end_) {
        cVar5 = '\0';
      }
      else {
        cVar5 = *(char *)&((align_spec *)local_50.ptr_)->width_;
      }
      ((this_00->
       super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
       ).super_specs_setter<char>.specs_)->type_ = cVar5;
    }
  }
  else {
    if (('/' < *(char *)&((align_spec *)local_50.ptr_)->width_) &&
       ((local_50.ptr_ == local_50.end_ || (*(char *)&((align_spec *)local_50.ptr_)->width_ < ':')))
       ) {
      uVar7 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&>
                        (&local_50,this_00);
      pbVar8 = (this_00->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
               ).super_specs_setter<char>.specs_;
      (pbVar8->super_align_spec).width_ = uVar7;
      goto LAB_0019190b;
    }
    if ((local_50.ptr_ == local_50.end_) || (*(char *)&((align_spec *)local_50.ptr_)->width_ != '{')
       ) goto LAB_0019190b;
    nVar15.end_ = (char *)&local_38;
    nVar15.ptr_ = local_50.end_;
    local_38 = this_00;
    nVar15 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,fmt::v5::internal::error_handler>>>&,char>>
                       ((internal *)((long)&((align_spec *)local_50.ptr_)->width_ + 1),nVar15,
                        (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>_>_&,_char>
                         *)pbVar8);
    local_50.end_ = nVar15.end_;
    pbVar12 = (basic_format_specs<char> *)nVar15.ptr_;
    pbVar8 = (basic_format_specs<char> *)((long)&(pbVar12->super_align_spec).width_ + 1);
    local_50.ptr_ = (char *)pbVar8;
    if ((pbVar12 != (basic_format_specs<char> *)local_50.end_) &&
       (*(char *)&(pbVar12->super_align_spec).width_ == '}')) goto LAB_0019190b;
LAB_001919cc:
    this_01 = (this_00->
              super_dynamic_specs_handler<fmt::v5::basic_parse_context<char,_fmt::v5::internal::error_handler>_>
              ).context_;
    message = "invalid format string";
LAB_001919e4:
    basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error(this_01,message);
    pbVar12 = (basic_format_specs<char> *)local_50.end_;
    this = (internal *)local_50.ptr_;
  }
LAB_00191a02:
  nVar16.end_ = (char *)pbVar12;
  nVar16.ptr_ = (char *)this;
  return nVar16;
}

Assistant:

FMT_CONSTEXPR Iterator parse_format_specs(Iterator it, SpecHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || !c)
    return it;

  // Parse fill and alignment.
  alignment align = ALIGN_DEFAULT;
  int i = 1;
  do {
    auto p = it + i;
    switch (*p) {
      case '<':
        align = ALIGN_LEFT;
        break;
      case '>':
        align = ALIGN_RIGHT;
        break;
      case '=':
        align = ALIGN_NUMERIC;
        break;
      case '^':
        align = ALIGN_CENTER;
        break;
    }
    if (align != ALIGN_DEFAULT) {
      if (p != it) {
        if (c == '{') {
          handler.on_error("invalid fill character '{'");
          return it;
        }
        it += 2;
        handler.on_fill(c);
      } else ++it;
      handler.on_align(align);
      break;
    }
  } while (--i >= 0);

  // Parse sign.
  switch (*it) {
    case '+':
      handler.on_plus();
      ++it;
      break;
    case '-':
      handler.on_minus();
      ++it;
      break;
    case ' ':
      handler.on_space();
      ++it;
      break;
  }

  if (*it == '#') {
    handler.on_hash();
    ++it;
  }

  // Parse zero flag.
  if (*it == '0') {
    handler.on_zero();
    ++it;
  }

  // Parse width.
  if ('0' <= *it && *it <= '9') {
    handler.on_width(parse_nonnegative_int(it, handler));
  } else if (*it == '{') {
    it = parse_arg_id(it + 1, width_adapter<SpecHandler, char_type>(handler));
    if (*it++ != '}') {
      handler.on_error("invalid format string");
      return it;
    }
  }

  // Parse precision.
  if (*it == '.') {
    ++it;
    if ('0' <= *it && *it <= '9') {
      handler.on_precision(parse_nonnegative_int(it, handler));
    } else if (*it == '{') {
      it = parse_arg_id(
            it + 1, precision_adapter<SpecHandler, char_type>(handler));
      if (*it++ != '}') {
        handler.on_error("invalid format string");
        return it;
      }
    } else {
      handler.on_error("missing precision specifier");
      return it;
    }
    handler.end_precision();
  }

  // Parse type.
  if (*it != '}' && *it)
    handler.on_type(*it++);
  return it;
}